

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctflt.c
# Opt level: O1

void jpeg_fdct_float(float *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  uVar4 = (ulong)start_col;
  lVar5 = 0;
  do {
    lVar3 = *(long *)((long)sample_data + lVar5);
    bVar1 = *(byte *)(lVar3 + 7 + uVar4);
    iVar11 = (uint)bVar1 + (uint)*(byte *)(lVar3 + uVar4);
    iVar6 = (uint)*(byte *)(lVar3 + uVar4) - (uint)bVar1;
    fVar14 = (float)iVar6;
    bVar1 = *(byte *)(lVar3 + 1 + uVar4);
    bVar2 = *(byte *)(lVar3 + 6 + uVar4);
    iVar7 = (uint)bVar2 + (uint)bVar1;
    iVar8 = (uint)bVar1 - (uint)bVar2;
    bVar1 = *(byte *)(lVar3 + 2 + uVar4);
    bVar2 = *(byte *)(lVar3 + 5 + uVar4);
    iVar13 = (uint)bVar2 + (uint)bVar1;
    iVar9 = (uint)bVar1 - (uint)bVar2;
    bVar1 = *(byte *)(lVar3 + 3 + uVar4);
    bVar2 = *(byte *)(lVar3 + 4 + uVar4);
    iVar12 = (uint)bVar2 + (uint)bVar1;
    iVar10 = iVar12 + iVar11;
    iVar11 = iVar11 - iVar12;
    fVar15 = (float)iVar11;
    iVar12 = iVar13 + iVar7;
    data[lVar5] = (float)(iVar12 + iVar10 + -0x400);
    data[lVar5 + 4] = (float)(iVar10 - iVar12);
    fVar16 = (float)((iVar7 - iVar13) + iVar11) * 0.70710677;
    data[lVar5 + 2] = fVar16 + fVar15;
    data[lVar5 + 6] = fVar15 - fVar16;
    iVar10 = ((uint)bVar1 - (uint)bVar2) + iVar9;
    iVar6 = iVar8 + iVar6;
    fVar17 = (float)(iVar10 - iVar6) * 0.38268343;
    fVar15 = (float)iVar10 * 0.5411961 + fVar17;
    fVar17 = (float)iVar6 * 1.306563 + fVar17;
    fVar16 = (float)(iVar9 + iVar8) * 0.70710677;
    fVar18 = fVar16 + fVar14;
    fVar14 = fVar14 - fVar16;
    data[lVar5 + 5] = fVar14 + fVar15;
    data[lVar5 + 3] = fVar14 - fVar15;
    data[lVar5 + 1] = fVar18 + fVar17;
    data[lVar5 + 7] = fVar18 - fVar17;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x40);
  lVar5 = 0;
  do {
    fVar16 = data[lVar5] + data[lVar5 + 0x38];
    fVar17 = data[lVar5] - data[lVar5 + 0x38];
    fVar19 = data[lVar5 + 8] + data[lVar5 + 0x30];
    fVar15 = data[lVar5 + 8] - data[lVar5 + 0x30];
    fVar20 = data[lVar5 + 0x10] + data[lVar5 + 0x28];
    fVar18 = data[lVar5 + 0x10] - data[lVar5 + 0x28];
    fVar14 = data[lVar5 + 0x20];
    fVar22 = data[lVar5 + 0x18] + fVar14;
    fVar21 = fVar16 + fVar22;
    fVar16 = fVar16 - fVar22;
    fVar22 = fVar19 + fVar20;
    data[lVar5] = fVar22 + fVar21;
    data[lVar5 + 0x20] = fVar21 - fVar22;
    fVar19 = ((fVar19 - fVar20) + fVar16) * 0.70710677;
    data[lVar5 + 0x10] = fVar16 + fVar19;
    data[lVar5 + 0x30] = fVar16 - fVar19;
    fVar19 = (data[lVar5 + 0x18] - fVar14) + fVar18;
    fVar14 = fVar15 + fVar17;
    fVar16 = (fVar19 - fVar14) * 0.38268343;
    fVar19 = fVar19 * 0.5411961 + fVar16;
    fVar16 = fVar14 * 1.306563 + fVar16;
    fVar14 = (fVar18 + fVar15) * 0.70710677;
    fVar15 = fVar17 + fVar14;
    fVar17 = fVar17 - fVar14;
    data[lVar5 + 0x28] = fVar17 + fVar19;
    data[lVar5 + 0x18] = fVar17 - fVar19;
    data[lVar5 + 8] = fVar15 + fVar16;
    data[lVar5 + 0x38] = fVar15 - fVar16;
    lVar5 = lVar5 + 1;
  } while ((int)lVar5 != 8);
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_float (FAST_FLOAT * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  FAST_FLOAT tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  FAST_FLOAT tmp10, tmp11, tmp12, tmp13;
  FAST_FLOAT z1, z2, z3, z4, z5, z11, z13;
  FAST_FLOAT *dataptr;
  JSAMPROW elemptr;
  int ctr;

  /* Pass 1: process rows. */

  dataptr = data;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Load data into workspace */
    tmp0 = (FAST_FLOAT) (GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[7]));
    tmp7 = (FAST_FLOAT) (GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[7]));
    tmp1 = (FAST_FLOAT) (GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[6]));
    tmp6 = (FAST_FLOAT) (GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[6]));
    tmp2 = (FAST_FLOAT) (GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[5]));
    tmp5 = (FAST_FLOAT) (GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[5]));
    tmp3 = (FAST_FLOAT) (GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[4]));
    tmp4 = (FAST_FLOAT) (GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[4]));

    /* Even part */

    tmp10 = tmp0 + tmp3;	/* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    /* Apply unsigned->signed conversion */
    dataptr[0] = tmp10 + tmp11 - 8 * CENTERJSAMPLE; /* phase 3 */
    dataptr[4] = tmp10 - tmp11;

    z1 = (tmp12 + tmp13) * ((FAST_FLOAT) 0.707106781); /* c4 */
    dataptr[2] = tmp13 + z1;	/* phase 5 */
    dataptr[6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;	/* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = (tmp10 - tmp12) * ((FAST_FLOAT) 0.382683433); /* c6 */
    z2 = ((FAST_FLOAT) 0.541196100) * tmp10 + z5; /* c2-c6 */
    z4 = ((FAST_FLOAT) 1.306562965) * tmp12 + z5; /* c2+c6 */
    z3 = tmp11 * ((FAST_FLOAT) 0.707106781); /* c4 */

    z11 = tmp7 + z3;		/* phase 5 */
    z13 = tmp7 - z3;

    dataptr[5] = z13 + z2;	/* phase 6 */
    dataptr[3] = z13 - z2;
    dataptr[1] = z11 + z4;
    dataptr[7] = z11 - z4;

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns. */

  dataptr = data;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*7];
    tmp7 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*6];
    tmp6 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*5];
    tmp5 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] + dataptr[DCTSIZE*4];
    tmp4 = dataptr[DCTSIZE*3] - dataptr[DCTSIZE*4];

    /* Even part */

    tmp10 = tmp0 + tmp3;	/* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[DCTSIZE*0] = tmp10 + tmp11; /* phase 3 */
    dataptr[DCTSIZE*4] = tmp10 - tmp11;

    z1 = (tmp12 + tmp13) * ((FAST_FLOAT) 0.707106781); /* c4 */
    dataptr[DCTSIZE*2] = tmp13 + z1; /* phase 5 */
    dataptr[DCTSIZE*6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;	/* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = (tmp10 - tmp12) * ((FAST_FLOAT) 0.382683433); /* c6 */
    z2 = ((FAST_FLOAT) 0.541196100) * tmp10 + z5; /* c2-c6 */
    z4 = ((FAST_FLOAT) 1.306562965) * tmp12 + z5; /* c2+c6 */
    z3 = tmp11 * ((FAST_FLOAT) 0.707106781); /* c4 */

    z11 = tmp7 + z3;		/* phase 5 */
    z13 = tmp7 - z3;

    dataptr[DCTSIZE*5] = z13 + z2; /* phase 6 */
    dataptr[DCTSIZE*3] = z13 - z2;
    dataptr[DCTSIZE*1] = z11 + z4;
    dataptr[DCTSIZE*7] = z11 - z4;

    dataptr++;			/* advance pointer to next column */
  }
}